

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::image_type_glsl_abi_cxx11_(CompilerMSL *this,SPIRType *type,uint32_t id)

{
  Dim DVar1;
  int iVar2;
  bool bVar3;
  uint32_t uVar4;
  CompilerError *pCVar5;
  size_t sVar6;
  SPIRType *pSVar7;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  char *pcVar8;
  byte local_422;
  byte local_421;
  SPIRVariable *local_358;
  SPIRVariable *p_var;
  undefined1 local_32a;
  allocator local_329;
  string local_328 [36];
  undefined4 local_304;
  undefined1 local_300 [8];
  SPIRType img_type_4;
  string local_1a8 [5];
  bool subpass_array;
  undefined1 local_182;
  allocator local_181;
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [32];
  TypedID *local_138;
  ImageType *img_type;
  string img_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  SPIRType *local_f0;
  SPIRType *parent;
  string local_e0 [32];
  uint32_t local_c0;
  undefined1 local_ba;
  allocator local_b9;
  uint32_t array_size;
  undefined1 local_92;
  allocator local_91;
  string local_90 [35];
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  uint32_t local_38;
  uint32_t local_34;
  uint32_t minor;
  uint32_t major;
  SPIRVariable *var;
  SPIRType *pSStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  pSStack_20 = (SPIRType *)CONCAT44(in_register_00000014,id);
  var._4_4_ = in_ECX;
  type_local = type;
  this_local = this;
  _minor = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)type,in_ECX);
  if ((_minor != (SPIRVariable *)0x0) &&
     (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_minor->basevariable), uVar4 != 0))
  {
    var._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&_minor->basevariable);
  }
  bVar3 = VectorView<unsigned_int>::empty(&(pSStack_20->array).super_VectorView<unsigned_int>);
  if (!bVar3) {
    local_34 = 2;
    local_38 = 0;
    bVar3 = Options::is_ios((Options *)&type[0x1d].image.sampled);
    if (bVar3) {
      local_34 = 1;
      local_38 = 2;
    }
    bVar3 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,local_34,local_38,0);
    if (!bVar3) {
      bVar3 = Options::is_ios((Options *)&type[0x1d].image.sampled);
      if (bVar3) {
        local_6d = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_58,"MSL 1.2 or greater is required for arrays of textures.",&local_59);
        CompilerError::CompilerError(pCVar5,(string *)local_58);
        local_6d = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_92 = 1;
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_90,"MSL 2.0 or greater is required for arrays of textures.",&local_91);
      CompilerError::CompilerError(pCVar5,(string *)local_90);
      local_92 = 0;
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    sVar6 = VectorView<unsigned_int>::size(&(pSStack_20->array).super_VectorView<unsigned_int>);
    if (1 < sVar6) {
      local_ba = 1;
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&array_size,"Arrays of arrays of textures are not supported in MSL.",
                 &local_b9);
      CompilerError::CompilerError(pCVar5,(string *)&array_size);
      local_ba = 0;
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_c0 = CompilerGLSL::to_array_size_literal((CompilerGLSL *)type,pSStack_20);
    if (local_c0 == 0) {
      local_c0 = get_resource_array_size((CompilerMSL *)type,var._4_4_);
    }
    if (local_c0 != 0) {
      pSVar7 = Compiler::get_pointee_type((Compiler *)type,pSStack_20);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar7->parent_type);
      local_f0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
      (*(type->super_IVariant)._vptr_IVariant[0x17])(local_110,type,local_f0,(ulong)var._4_4_);
      join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [7])0x5f127c,local_110,(char (*) [3])0x5fe6df,
                 &local_c0,(char (*) [2])0x5f0ee9);
      ::std::__cxx11::string::~string((string *)local_110);
      return this;
    }
    parent._6_1_ = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_e0,"Unsized array of images is not supported in MSL.",
               (allocator *)((long)&parent + 7));
    CompilerError::CompilerError(pCVar5,(string *)local_e0);
    parent._6_1_ = 0;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ::std::__cxx11::string::string((string *)&img_type);
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
  pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
  local_138 = (TypedID *)&pSVar7->image;
  bVar3 = Compiler::is_depth_image((Compiler *)type,pSStack_20,var._4_4_);
  if (bVar3) {
    DVar1 = *(Dim *)(local_138 + 4);
    if (DVar1 < Dim3D) {
      if ((*(Dim *)(local_138 + 4) == Dim1D) && ((type[0x1e].super_IVariant.field_0xf & 1) == 0)) {
        ::std::__cxx11::string::operator+=((string *)&img_type,"depth1d_unsupported_by_metal");
      }
      else if ((((byte)local_138[10] & 1) == 0) || (((byte)local_138[9] & 1) == 0)) {
        if (((byte)local_138[10] & 1) == 0) {
          if (((byte)local_138[9] & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d");
          }
          else {
            ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d_array");
          }
        }
        else {
          ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d_ms");
        }
      }
      else {
        bVar3 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,1,0);
        if (!bVar3) {
          local_15a = 1;
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_158,"Multisampled array textures are supported from 2.1.",&local_159);
          CompilerError::CompilerError(pCVar5,(string *)local_158);
          local_15a = 0;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,"depth2d_ms_array");
      }
    }
    else if (DVar1 == Dim3D) {
      ::std::__cxx11::string::operator+=((string *)&img_type,"depth3d_unsupported_by_metal");
    }
    else if (DVar1 == DimCube) {
      if ((type[0x1e].field_0x1d & 1) == 0) {
        pcVar8 = "depthcube";
        if (((byte)local_138[9] & 1) != 0) {
          pcVar8 = "depthcube_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar8);
      }
      else {
        pcVar8 = "depthcube";
        if (((byte)local_138[9] & 1) != 0) {
          pcVar8 = "depth2d_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar8);
      }
    }
    else {
      ::std::__cxx11::string::operator+=((string *)&img_type,"unknown_depth_texture_type");
    }
  }
  else {
    switch(*(Dim *)(local_138 + 4)) {
    case Dim1D:
    case Dim2D:
    case DimSubpassData:
      local_421 = 0;
      if (*(Dim *)(local_138 + 4) == DimSubpassData) {
        local_422 = 1;
        if ((type[0x1e].super_IVariant.self.id & 0x1000000) == 0) {
          local_422 = *(byte *)((long)&type[0x1e].array.super_VectorView<unsigned_int>.ptr + 7);
        }
        local_421 = local_422;
      }
      img_type_4.member_name_cache._M_h._M_single_bucket._5_1_ = local_421 & 1;
      if ((*(Dim *)(local_138 + 4) == Dim1D) && ((type[0x1e].super_IVariant.field_0xf & 1) == 0)) {
        pcVar8 = "texture1d";
        if (((byte)local_138[9] & 1) != 0) {
          pcVar8 = "texture1d_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar8);
      }
      else {
        bVar3 = type_is_msl_framebuffer_fetch((CompilerMSL *)type,pSStack_20);
        if (bVar3) {
          uVar4 = TypedID::operator_cast_to_unsigned_int(local_138);
          pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
          SPIRType::SPIRType((SPIRType *)local_300,pSVar7);
          img_type_4.super_IVariant._12_4_ = 4;
          (*(type->super_IVariant)._vptr_IVariant[0x13])(this,type,local_300,0);
          local_304 = 1;
          SPIRType::~SPIRType((SPIRType *)local_300);
          goto LAB_004f0690;
        }
        if ((((byte)local_138[10] & 1) == 0) ||
           ((((byte)local_138[9] & 1) == 0 &&
            ((img_type_4.member_name_cache._M_h._M_single_bucket._5_1_ & 1) == 0)))) {
          if (((byte)local_138[10] & 1) == 0) {
            if ((((byte)local_138[9] & 1) == 0) &&
               ((img_type_4.member_name_cache._M_h._M_single_bucket._5_1_ & 1) == 0)) {
              ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d");
            }
            else {
              ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d_array");
            }
          }
          else {
            ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d_ms");
          }
        }
        else {
          bVar3 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,1,0);
          if (!bVar3) {
            local_32a = 1;
            pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_328,"Multisampled array textures are supported from 2.1.",&local_329);
            CompilerError::CompilerError(pCVar5,(string *)local_328);
            local_32a = 0;
            __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d_ms_array");
        }
      }
      break;
    case Dim3D:
      ::std::__cxx11::string::operator+=((string *)&img_type,"texture3d");
      break;
    case DimCube:
      if ((type[0x1e].field_0x1d & 1) == 0) {
        pcVar8 = "texturecube";
        if (((byte)local_138[9] & 1) != 0) {
          pcVar8 = "texturecube_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar8);
      }
      else {
        pcVar8 = "texturecube";
        if (((byte)local_138[9] & 1) != 0) {
          pcVar8 = "texture2d_array";
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,pcVar8);
      }
      break;
    default:
      ::std::__cxx11::string::operator+=((string *)&img_type,"unknown_texture_type");
      break;
    case DimBuffer:
      if ((((byte)local_138[10] & 1) != 0) || (((byte)local_138[9] & 1) != 0)) {
        local_182 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_180,"Cannot use texel buffers with multisampling or array layers.",
                   &local_181);
        CompilerError::CompilerError(pCVar5,(string *)local_180);
        local_182 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((type[0x1e].field_0x1f & 1) == 0) {
        ::std::__cxx11::string::operator+=((string *)&img_type,"texture2d");
      }
      else {
        bVar3 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,1,0);
        if (!bVar3) {
          img_type_4.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1a8,"Native texture_buffer type is only supported in MSL 2.1.",
                     (allocator *)((long)&img_type_4.member_name_cache._M_h._M_single_bucket + 7));
          CompilerError::CompilerError(pCVar5,(string *)local_1a8);
          img_type_4.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        ::std::__cxx11::string::operator=((string *)&img_type,"texture_buffer");
      }
    }
  }
  ::std::__cxx11::string::operator+=((string *)&img_type,"<");
  uVar4 = TypedID::operator_cast_to_unsigned_int(local_138);
  pSVar7 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar4);
  (*(type->super_IVariant)._vptr_IVariant[0x13])(&p_var,type,pSVar7,0);
  ::std::__cxx11::string::operator+=((string *)&img_type,(string *)&p_var);
  ::std::__cxx11::string::~string((string *)&p_var);
  if (((*(int *)&(pSStack_20->super_IVariant).field_0xc == 0x10) &&
      ((pSStack_20->image).sampled == 2)) && ((pSStack_20->image).dim != DimSubpassData)) {
    iVar2 = *(int *)(local_138 + 0x14);
    if (iVar2 == 0) {
      ::std::__cxx11::string::operator+=((string *)&img_type,", access::read");
    }
    else if (iVar2 == 1) {
      ::std::__cxx11::string::operator+=((string *)&img_type,", access::write");
    }
    else if (iVar2 == 2) {
      ::std::__cxx11::string::operator+=((string *)&img_type,", access::read_write");
    }
    else {
      local_358 = Compiler::maybe_get_backing_variable((Compiler *)type,var._4_4_);
      if ((local_358 != (SPIRVariable *)0x0) &&
         (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_358->basevariable),
         uVar4 != 0)) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_358->basevariable);
        local_358 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)type,uVar4);
      }
      if ((local_358 != (SPIRVariable *)0x0) &&
         (bVar3 = Compiler::has_decoration
                            ((Compiler *)type,(ID)(local_358->super_IVariant).self.id,
                             DecorationNonWritable), !bVar3)) {
        ::std::__cxx11::string::operator+=((string *)&img_type,", access::");
        bVar3 = Compiler::has_decoration
                          ((Compiler *)type,(ID)(local_358->super_IVariant).self.id,
                           DecorationNonReadable);
        if (!bVar3) {
          ::std::__cxx11::string::operator+=((string *)&img_type,"read_");
        }
        ::std::__cxx11::string::operator+=((string *)&img_type,"write");
      }
    }
  }
  ::std::__cxx11::string::operator+=((string *)&img_type,">");
  ::std::__cxx11::string::string((string *)this,(string *)&img_type);
  local_304 = 1;
LAB_004f0690:
  ::std::__cxx11::string::~string((string *)&img_type);
  return this;
}

Assistant:

string CompilerMSL::image_type_glsl(const SPIRType &type, uint32_t id)
{
	auto *var = maybe_get<SPIRVariable>(id);
	if (var && var->basevariable)
	{
		// For comparison images, check against the base variable,
		// and not the fake ID which might have been generated for this variable.
		id = var->basevariable;
	}

	if (!type.array.empty())
	{
		uint32_t major = 2, minor = 0;
		if (msl_options.is_ios())
		{
			major = 1;
			minor = 2;
		}
		if (!msl_options.supports_msl_version(major, minor))
		{
			if (msl_options.is_ios())
				SPIRV_CROSS_THROW("MSL 1.2 or greater is required for arrays of textures.");
			else
				SPIRV_CROSS_THROW("MSL 2.0 or greater is required for arrays of textures.");
		}

		if (type.array.size() > 1)
			SPIRV_CROSS_THROW("Arrays of arrays of textures are not supported in MSL.");

		// Arrays of images in MSL must be declared with a special array<T, N> syntax ala C++11 std::array.
		// If we have a runtime array, it could be a variable-count descriptor set binding.
		uint32_t array_size = to_array_size_literal(type);
		if (array_size == 0)
			array_size = get_resource_array_size(id);

		if (array_size == 0)
			SPIRV_CROSS_THROW("Unsized array of images is not supported in MSL.");

		auto &parent = get<SPIRType>(get_pointee_type(type).parent_type);
		return join("array<", image_type_glsl(parent, id), ", ", array_size, ">");
	}

	string img_type_name;

	// Bypass pointers because we need the real image struct
	auto &img_type = get<SPIRType>(type.self).image;
	if (is_depth_image(type, id))
	{
		switch (img_type.dim)
		{
		case Dim1D:
		case Dim2D:
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += "depth1d_unsupported_by_metal";
				break;
			}

			if (img_type.ms && img_type.arrayed)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "depth2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "depth2d_ms";
			else if (img_type.arrayed)
				img_type_name += "depth2d_array";
			else
				img_type_name += "depth2d";
			break;
		case Dim3D:
			img_type_name += "depth3d_unsupported_by_metal";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "depthcube_array" : "depthcube");
			else
				img_type_name += (img_type.arrayed ? "depth2d_array" : "depthcube");
			break;
		default:
			img_type_name += "unknown_depth_texture_type";
			break;
		}
	}
	else
	{
		switch (img_type.dim)
		{
		case DimBuffer:
			if (img_type.ms || img_type.arrayed)
				SPIRV_CROSS_THROW("Cannot use texel buffers with multisampling or array layers.");

			if (msl_options.texture_buffer_native)
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Native texture_buffer type is only supported in MSL 2.1.");
				img_type_name = "texture_buffer";
			}
			else
				img_type_name += "texture2d";
			break;
		case Dim1D:
		case Dim2D:
		case DimSubpassData:
		{
			bool subpass_array =
			    img_type.dim == DimSubpassData && (msl_options.multiview || msl_options.arrayed_subpass_input);
			if (img_type.dim == Dim1D && !msl_options.texture_1D_as_2D)
			{
				// Use a native Metal 1D texture
				img_type_name += (img_type.arrayed ? "texture1d_array" : "texture1d");
				break;
			}

			// Use Metal's native frame-buffer fetch API for subpass inputs.
			if (type_is_msl_framebuffer_fetch(type))
			{
				auto img_type_4 = get<SPIRType>(img_type.type);
				img_type_4.vecsize = 4;
				return type_to_glsl(img_type_4);
			}
			if (img_type.ms && (img_type.arrayed || subpass_array))
			{
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Multisampled array textures are supported from 2.1.");
				img_type_name += "texture2d_ms_array";
			}
			else if (img_type.ms)
				img_type_name += "texture2d_ms";
			else if (img_type.arrayed || subpass_array)
				img_type_name += "texture2d_array";
			else
				img_type_name += "texture2d";
			break;
		}
		case Dim3D:
			img_type_name += "texture3d";
			break;
		case DimCube:
			if (!msl_options.emulate_cube_array)
				img_type_name += (img_type.arrayed ? "texturecube_array" : "texturecube");
			else
				img_type_name += (img_type.arrayed ? "texture2d_array" : "texturecube");
			break;
		default:
			img_type_name += "unknown_texture_type";
			break;
		}
	}

	// Append the pixel type
	img_type_name += "<";
	img_type_name += type_to_glsl(get<SPIRType>(img_type.type));

	// For unsampled images, append the sample/read/write access qualifier.
	// For kernel images, the access qualifier my be supplied directly by SPIR-V.
	// Otherwise it may be set based on whether the image is read from or written to within the shader.
	if (type.basetype == SPIRType::Image && type.image.sampled == 2 && type.image.dim != DimSubpassData)
	{
		switch (img_type.access)
		{
		case AccessQualifierReadOnly:
			img_type_name += ", access::read";
			break;

		case AccessQualifierWriteOnly:
			img_type_name += ", access::write";
			break;

		case AccessQualifierReadWrite:
			img_type_name += ", access::read_write";
			break;

		default:
		{
			auto *p_var = maybe_get_backing_variable(id);
			if (p_var && p_var->basevariable)
				p_var = maybe_get<SPIRVariable>(p_var->basevariable);
			if (p_var && !has_decoration(p_var->self, DecorationNonWritable))
			{
				img_type_name += ", access::";

				if (!has_decoration(p_var->self, DecorationNonReadable))
					img_type_name += "read_";

				img_type_name += "write";
			}
			break;
		}
		}
	}

	img_type_name += ">";

	return img_type_name;
}